

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O0

void printBuffer(InputBuffer *buf)

{
  streambuf *this;
  void *this_00;
  istream is;
  InputBuffer *in_stack_fffffffffffffe58;
  istream *in_stack_fffffffffffffe60;
  
  avro::istream::istream(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  this = (streambuf *)std::ios::rdbuf();
  this_00 = (void *)std::ostream::operator<<(&std::cout,this);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  avro::istream::~istream((istream *)this);
  return;
}

Assistant:

void printBuffer(const InputBuffer &buf) 
{
    avro::istream is(buf);
    cout << is.rdbuf() << endl;
}